

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

bool flatbuffers::DirExists(char *name)

{
  int iVar1;
  stat file_info;
  stat sStack_98;
  
  iVar1 = stat(name,&sStack_98);
  return (bool)((byte)(sStack_98.st_mode >> 0xe) & 1 & iVar1 == 0);
}

Assistant:

bool DirExists(const char *name) {
  // clang-format off

  #ifdef _WIN32
    #define flatbuffers_stat _stat
    #define FLATBUFFERS_S_IFDIR _S_IFDIR
  #else
    #define flatbuffers_stat stat
    #define FLATBUFFERS_S_IFDIR S_IFDIR
  #endif
  // clang-format on
  struct flatbuffers_stat file_info;
  if (flatbuffers_stat(name, &file_info) != 0) return false;
  return (file_info.st_mode & FLATBUFFERS_S_IFDIR) != 0;
}